

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

uint8_t * __thiscall
google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault::_InternalSerialize
          (FeatureSetDefaults_FeatureSetEditionDefault *this,uint8_t *target,
          EpsCopyOutputStream *stream)

{
  FeatureSet *pFVar1;
  ulong uVar2;
  anon_union_32_1_493b367e_for_FeatureSetDefaults_FeatureSetEditionDefault_3 aVar3;
  uint8_t *puVar4;
  
  aVar3 = this->field_0;
  if (((undefined1  [32])aVar3 & (undefined1  [32])0x4) != (undefined1  [32])0x0) {
    puVar4 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = internal::WireFormatLite::WriteEnumToArray(3,(this->field_0)._impl_.edition_,puVar4);
  }
  if (((undefined1  [32])aVar3 & (undefined1  [32])0x1) != (undefined1  [32])0x0) {
    pFVar1 = (this->field_0)._impl_.overridable_features_;
    target = internal::WireFormatLite::InternalWriteMessage
                       (4,(MessageLite *)pFVar1,(pFVar1->field_0)._impl_._cached_size_.atom_,target,
                        stream);
  }
  if (((undefined1  [32])aVar3 & (undefined1  [32])0x2) != (undefined1  [32])0x0) {
    pFVar1 = (this->field_0)._impl_.fixed_features_;
    target = internal::WireFormatLite::InternalWriteMessage
                       (5,(MessageLite *)pFVar1,(pFVar1->field_0)._impl_._cached_size_.atom_,target,
                        stream);
  }
  uVar2 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar2 & 1) == 0) {
    return target;
  }
  puVar4 = internal::WireFormat::InternalSerializeUnknownFieldsToArray
                     ((UnknownFieldSet *)((uVar2 & 0xfffffffffffffffe) + 8),target,stream);
  return puVar4;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL FeatureSetDefaults_FeatureSetEditionDefault::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const FeatureSetDefaults_FeatureSetEditionDefault& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.FeatureSetDefaults.FeatureSetEditionDefault)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // optional .google.protobuf.Edition edition = 3;
  if ((cached_has_bits & 0x00000004u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        3, this_._internal_edition(), target);
  }

  // optional .google.protobuf.FeatureSet overridable_features = 4;
  if ((cached_has_bits & 0x00000001u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        4, *this_._impl_.overridable_features_, this_._impl_.overridable_features_->GetCachedSize(), target,
        stream);
  }

  // optional .google.protobuf.FeatureSet fixed_features = 5;
  if ((cached_has_bits & 0x00000002u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        5, *this_._impl_.fixed_features_, this_._impl_.fixed_features_->GetCachedSize(), target,
        stream);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.FeatureSetDefaults.FeatureSetEditionDefault)
  return target;
}